

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     BinaryUpdate<duckdb::ArgMinMaxState<double,int>,double,int,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (AggregateInputData *aggr_input_data,Vector *a,Vector *b,data_ptr_t state,idx_t count
               )

{
  int iVar1;
  long lVar2;
  long lVar3;
  idx_t iVar4;
  byte bVar5;
  idx_t iVar6;
  idx_t iVar7;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  long *local_b0;
  long local_a8;
  long local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  long *local_68;
  long local_60;
  long local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_68);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_b0);
  duckdb::Vector::ToUnifiedFormat((ulong)a,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)b,(UnifiedVectorFormat *)count);
  if (local_58 == 0 && local_a0 == 0) {
    if (count != 0) {
      lVar2 = *local_68;
      lVar3 = *local_b0;
      bVar5 = *state;
      iVar4 = 0;
      do {
        iVar6 = iVar4;
        if (lVar2 != 0) {
          iVar6 = (idx_t)*(uint *)(lVar2 + iVar4 * 4);
        }
        iVar7 = iVar4;
        if (lVar3 != 0) {
          iVar7 = (idx_t)*(uint *)(lVar3 + iVar4 * 4);
        }
        if ((bVar5 & 1) == 0) {
          *(undefined8 *)(state + 8) = *(undefined8 *)(local_60 + iVar6 * 8);
          *(undefined4 *)(state + 0x10) = *(undefined4 *)(local_a8 + iVar7 * 4);
          *state = '\x01';
          bVar5 = 1;
        }
        else {
          iVar1 = *(int *)(local_a8 + iVar7 * 4);
          if (*(int *)(state + 0x10) < iVar1) {
            *(undefined8 *)(state + 8) = *(undefined8 *)(local_60 + iVar6 * 8);
            *(int *)(state + 0x10) = iVar1;
          }
        }
        iVar4 = iVar4 + 1;
      } while (count != iVar4);
    }
  }
  else if (count != 0) {
    lVar2 = *local_68;
    lVar3 = *local_b0;
    iVar4 = 0;
    do {
      iVar6 = iVar4;
      if (lVar2 != 0) {
        iVar6 = (idx_t)*(uint *)(lVar2 + iVar4 * 4);
      }
      iVar7 = iVar4;
      if (lVar3 != 0) {
        iVar7 = (idx_t)*(uint *)(lVar3 + iVar4 * 4);
      }
      if (((local_58 == 0) || ((*(ulong *)(local_58 + (iVar6 >> 6) * 8) >> (iVar6 & 0x3f) & 1) != 0)
          ) && ((local_a0 == 0 ||
                ((*(ulong *)(local_a0 + (iVar7 >> 6) * 8) >> (iVar7 & 0x3f) & 1) != 0)))) {
        if (*state == '\0') {
          *(undefined8 *)(state + 8) = *(undefined8 *)(local_60 + iVar6 * 8);
          *(undefined4 *)(state + 0x10) = *(undefined4 *)(local_a8 + iVar7 * 4);
          *state = '\x01';
        }
        else {
          iVar1 = *(int *)(local_a8 + iVar7 * 4);
          if (*(int *)(state + 0x10) < iVar1) {
            *(undefined8 *)(state + 8) = *(undefined8 *)(local_60 + iVar6 * 8);
            *(int *)(state + 0x10) = iVar1;
          }
        }
      }
      iVar4 = iVar4 + 1;
    } while (count != iVar4);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  return;
}

Assistant:

static void BinaryUpdate(AggregateInputData &aggr_input_data, Vector &a, Vector &b, data_ptr_t state, idx_t count) {
		UnifiedVectorFormat adata, bdata;

		a.ToUnifiedFormat(count, adata);
		b.ToUnifiedFormat(count, bdata);

		BinaryUpdateLoop<STATE_TYPE, A_TYPE, B_TYPE, OP>(
		    UnifiedVectorFormat::GetData<A_TYPE>(adata), aggr_input_data, UnifiedVectorFormat::GetData<B_TYPE>(bdata),
		    (STATE_TYPE *)state, count, *adata.sel, *bdata.sel, adata.validity, bdata.validity);
	}